

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListFileCache.cxx
# Opt level: O3

bool __thiscall cmListFileParser::ParseFile(cmListFileParser *this)

{
  cmMakefile *this_00;
  bool bVar1;
  int iVar2;
  size_t sVar3;
  cmListFileLexer_Token *pcVar4;
  ostream *poVar5;
  char *pcVar6;
  cmListFileLexer_BOM bom;
  ostringstream m;
  string local_1c8;
  cmListFileLexer_BOM local_1a4;
  undefined1 local_1a0 [376];
  
  iVar2 = cmListFileLexer_SetFileName(this->Lexer,this->FileName,&local_1a4);
  if (iVar2 == 0) {
    bVar1 = false;
    cmSystemTools::Error
              ("cmListFileCache: error can not open file ",this->FileName,(char *)0x0,(char *)0x0);
  }
  else if (local_1a4 < cmListFileLexer_BOM_UTF16BE) {
    pcVar4 = cmListFileLexer_Scan(this->Lexer);
    if (pcVar4 != (cmListFileLexer_Token *)0x0) {
      bVar1 = true;
      do {
        switch(pcVar4->type) {
        case cmListFileLexer_Token_Space:
          break;
        case cmListFileLexer_Token_Newline:
          bVar1 = true;
          break;
        case cmListFileLexer_Token_Identifier:
          if (bVar1) {
            bVar1 = ParseFunction(this,pcVar4->text,(long)pcVar4->line);
            if (bVar1) {
              std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::push_back
                        (&this->ListFile->Functions,&this->Function);
              goto switchD_004691d2_caseD_9;
            }
            goto LAB_004692c2;
          }
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a0,"Error in cmake code at\n",0x17);
          pcVar6 = this->FileName;
          if (pcVar6 == (char *)0x0) {
            std::ios::clear((int)&local_1c8 + (int)*(_func_int **)(local_1a0._0_8_ + -0x18) + 0x28);
          }
          else {
            sVar3 = strlen(pcVar6);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,pcVar6,sVar3);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,":",1);
          poVar5 = (ostream *)std::ostream::operator<<(local_1a0,pcVar4->line);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,":\n",2);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar5,"Parse error.  Expected a newline, got ",0x26);
          pcVar6 = cmListFileLexer_GetTypeAsString(this->Lexer,pcVar4->type);
          if (pcVar6 == (char *)0x0) {
            std::ios::clear((int)poVar5 + (int)poVar5->_vptr_basic_ostream[-3]);
          }
          else {
            sVar3 = strlen(pcVar6);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,pcVar6,sVar3);
          }
          std::__ostream_insert<char,std::char_traits<char>>(poVar5," with text \"",0xc);
          pcVar6 = pcVar4->text;
          if (pcVar6 == (char *)0x0) {
            std::ios::clear((int)poVar5 + (int)poVar5->_vptr_basic_ostream[-3]);
          }
          else {
            sVar3 = strlen(pcVar6);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,pcVar6,sVar3);
          }
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\".",2);
          std::__cxx11::stringbuf::str();
          cmSystemTools::Error(local_1c8._M_dataplus._M_p,(char *)0x0,(char *)0x0,(char *)0x0);
          goto LAB_00469289;
        default:
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a0,"Error in cmake code at\n",0x17);
          pcVar6 = this->FileName;
          if (pcVar6 == (char *)0x0) {
            std::ios::clear((int)&local_1c8 + (int)*(_func_int **)(local_1a0._0_8_ + -0x18) + 0x28);
          }
          else {
            sVar3 = strlen(pcVar6);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,pcVar6,sVar3);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,":",1);
          poVar5 = (ostream *)std::ostream::operator<<(local_1a0,pcVar4->line);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,":\n",2);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar5,"Parse error.  Expected a command name, got ",0x2b);
          pcVar6 = cmListFileLexer_GetTypeAsString(this->Lexer,pcVar4->type);
          if (pcVar6 == (char *)0x0) {
            std::ios::clear((int)poVar5 + (int)poVar5->_vptr_basic_ostream[-3]);
          }
          else {
            sVar3 = strlen(pcVar6);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,pcVar6,sVar3);
          }
          std::__ostream_insert<char,std::char_traits<char>>(poVar5," with text \"",0xc);
          pcVar6 = pcVar4->text;
          if (pcVar6 == (char *)0x0) {
            std::ios::clear((int)poVar5 + (int)poVar5->_vptr_basic_ostream[-3]);
          }
          else {
            sVar3 = strlen(pcVar6);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,pcVar6,sVar3);
          }
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\".",2);
          std::__cxx11::stringbuf::str();
          cmSystemTools::Error(local_1c8._M_dataplus._M_p,(char *)0x0,(char *)0x0,(char *)0x0);
          goto LAB_00469289;
        case cmListFileLexer_Token_CommentBracket:
switchD_004691d2_caseD_9:
          bVar1 = false;
        }
        pcVar4 = cmListFileLexer_Scan(this->Lexer);
      } while (pcVar4 != (cmListFileLexer_Token *)0x0);
    }
    bVar1 = true;
  }
  else {
    cmListFileLexer_SetFileName(this->Lexer,(char *)0x0,(cmListFileLexer_BOM *)0x0);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"File\n  ",7);
    pcVar6 = this->FileName;
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)&local_1c8 + (int)*(_func_int **)(local_1a0._0_8_ + -0x18) + 0x28);
    }
    else {
      sVar3 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,pcVar6,sVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a0,"starts with a Byte-Order-Mark that is not UTF-8.",0x30);
    this_00 = this->Makefile;
    std::__cxx11::stringbuf::str();
    cmMakefile::IssueMessage(this_00,FATAL_ERROR,&local_1c8);
LAB_00469289:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
      operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
    std::ios_base::~ios_base((ios_base *)(local_1a0 + 0x70));
LAB_004692c2:
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool cmListFileParser::ParseFile()
{
  // Open the file.
  cmListFileLexer_BOM bom;
  if(!cmListFileLexer_SetFileName(this->Lexer, this->FileName, &bom))
    {
    cmSystemTools::Error("cmListFileCache: error can not open file ",
                         this->FileName);
    return false;
    }

  // Verify the Byte-Order-Mark, if any.
  if(bom != cmListFileLexer_BOM_None &&
     bom != cmListFileLexer_BOM_UTF8)
    {
    cmListFileLexer_SetFileName(this->Lexer, 0, 0);
    std::ostringstream m;
    m << "File\n  " << this->FileName << "\n"
      << "starts with a Byte-Order-Mark that is not UTF-8.";
    this->Makefile->IssueMessage(cmake::FATAL_ERROR, m.str());
    return false;
    }

  // Use a simple recursive-descent parser to process the token
  // stream.
  bool haveNewline = true;
  while(cmListFileLexer_Token* token =
        cmListFileLexer_Scan(this->Lexer))
    {
    if(token->type == cmListFileLexer_Token_Space)
      {
      }
    else if(token->type == cmListFileLexer_Token_Newline)
      {
      haveNewline = true;
      }
    else if(token->type == cmListFileLexer_Token_CommentBracket)
      {
      haveNewline = false;
      }
    else if(token->type == cmListFileLexer_Token_Identifier)
      {
      if(haveNewline)
        {
        haveNewline = false;
        if(this->ParseFunction(token->text, token->line))
          {
          this->ListFile->Functions.push_back(this->Function);
          }
        else
          {
          return false;
          }
        }
      else
        {
        std::ostringstream error;
        error << "Error in cmake code at\n"
              << this->FileName << ":" << token->line << ":\n"
              << "Parse error.  Expected a newline, got "
              << cmListFileLexer_GetTypeAsString(this->Lexer, token->type)
              << " with text \"" << token->text << "\".";
        cmSystemTools::Error(error.str().c_str());
        return false;
        }
      }
    else
      {
      std::ostringstream error;
      error << "Error in cmake code at\n"
            << this->FileName << ":" << token->line << ":\n"
            << "Parse error.  Expected a command name, got "
            << cmListFileLexer_GetTypeAsString(this->Lexer, token->type)
            << " with text \""
            << token->text << "\".";
      cmSystemTools::Error(error.str().c_str());
      return false;
      }
    }
  return true;
}